

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
copy_str<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_38;
  value_type_conflict3 local_2a;
  char *local_28;
  char *end_local;
  char *begin_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  local_28 = end;
  end_local = begin;
  begin_local = (char *)out.container;
  while (end_local != local_28) {
    local_2a = (value_type_conflict3)*end_local;
    end_local = end_local + 1;
    local_38 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                         ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *)&begin_local,0
                         );
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(this,&local_2a);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)(buffer<char16_t> *)begin_local;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}